

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O3

void __thiscall chrono::ChForce::SetVpoint(ChForce *this,ChVector<double> *mypoint)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  ChVector<double> *mpoint;
  double dVar6;
  double local_48;
  double local_40;
  ChVector<double> local_38;
  
  mpoint = &this->vpoint;
  if (mpoint != mypoint) {
    (this->vpoint).m_data[0] = mypoint->m_data[0];
    (this->vpoint).m_data[1] = mypoint->m_data[1];
    (this->vpoint).m_data[2] = mypoint->m_data[2];
  }
  ChBody::Point_World2Body(&local_38,this->Body,mpoint);
  if (&local_38 != &this->vrelpoint) {
    (this->vrelpoint).m_data[0] = local_38.m_data[0];
    (this->vrelpoint).m_data[1] = local_38.m_data[1];
    (this->vrelpoint).m_data[2] = local_38.m_data[2];
  }
  peVar3 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = DAT_00b689a0;
  local_48 = DAT_00b689a8;
  dVar6 = VNULL;
  if (peVar3 != (element_type *)0x0) {
    dVar6 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  peVar3 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_40 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  peVar3 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_48 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  if (this->frame == WORLD) {
    lVar4 = 0x58;
    lVar5 = 0x60;
  }
  else {
    if (this->frame != BODY) {
      return;
    }
    lVar4 = 0x70;
    lVar5 = 0x78;
    mpoint = &this->vrelpoint;
  }
  dVar1 = *(double *)((long)(this->vpoint).m_data + lVar5 + -0x50);
  dVar2 = *(double *)((long)(this->vpoint).m_data + lVar4 + -0x50);
  (this->restpos).m_data[0] = mpoint->m_data[0] - dVar6;
  (this->restpos).m_data[1] = dVar2 - local_40;
  (this->restpos).m_data[2] = dVar1 - local_48;
  return;
}

Assistant:

void ChForce::SetVpoint(ChVector<> mypoint) {
    // abs pos
    vpoint = mypoint;
    // rel pos
    vrelpoint = GetBody()->Point_World2Body(vpoint);

    // computes initial rest position.
    ChVector<> displace = VNULL;
    if (move_x)
        displace.x() = move_x->Get_y(ChTime);
    if (move_y)
        displace.y() = move_y->Get_y(ChTime);
    if (move_z)
        displace.z() = move_z->Get_y(ChTime);

    switch (frame) {
        case WORLD:
            restpos = Vsub(vpoint, displace);
            break;
        case BODY:
            restpos = Vsub(vrelpoint, displace);
            break;
    }
}